

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitdeque.h
# Opt level: O3

void __thiscall bitdeque<32768>::extend_back(bitdeque<32768> *this,size_type n)

{
  int iVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  const_iterator in_stack_ffffffffffffef88;
  _Elt_pointer local_1058;
  _Elt_pointer pbStack_1050;
  _Elt_pointer local_1048;
  _Map_pointer ppbStack_1040;
  undefined1 local_1030 [8];
  undefined8 local_1028;
  long local_30;
  
  local_1028 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = this->m_pad_end;
  if ((ulong)(long)iVar1 < n) {
    uVar2 = ~(long)iVar1 + n;
    this->m_pad_end = 0x7fff;
    local_1058 = (this->m_deque).
                 super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
    pbStack_1050 = (this->m_deque).
                   super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_first;
    local_1048 = (this->m_deque).
                 super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_last;
    ppbStack_1040 =
         (this->m_deque).
         super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
         super__Deque_impl_data._M_finish._M_node;
    memset(local_1030,0,0x1000);
    std::deque<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>::insert
              ((iterator *)&stack0xffffffffffffef88,&this->m_deque,in_stack_ffffffffffffef88,
               (size_type)&local_1058,(value_type *)((uVar2 >> 0xf) + 1));
    n = (size_type)((uint)uVar2 & 0x7fff);
    iVar1 = this->m_pad_end;
  }
  this->m_pad_end = iVar1 - (int)n;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void extend_back(size_type n)
    {
        if (n > static_cast<size_type>(m_pad_end)) {
            n -= m_pad_end + 1;
            m_pad_end = BITS_PER_WORD - 1;
            m_deque.insert(m_deque.end(), 1 + (n / BITS_PER_WORD), {});
            n %= BITS_PER_WORD;
        }
        m_pad_end -= n;
    }